

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O3

void advance_storagestate(DLword flg)

{
  ushort uVar1;
  uint datum;
  DLword *pDVar2;
  LispPTR LVar3;
  LispPTR LVar4;
  LispPTR LVar5;
  LispPTR LVar6;
  uint uVar7;
  undefined6 in_register_0000003a;
  
  *STORAGEFULLSTATE_word = (uint)CONCAT62(in_register_0000003a,flg) | 0xe0000;
  InterfacePage->fullspaceused = 0xffff;
  LVar3 = STORAGEFULLSTATE_index;
  datum = *SYSTEMCACHEVARS_word;
  uVar7 = 0;
  if ((*(ushort *)((ulong)((datum >> 9) * 2) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
    do {
      LVar4 = car(datum);
      pDVar2 = MDStypetbl;
      if (LVar4 != LVar3) {
        LVar4 = cdr(datum);
        uVar1 = *(ushort *)((ulong)(pDVar2 + (LVar4 >> 9)) ^ 2);
        LVar4 = datum;
        while (uVar7 = datum, (uVar1 & 0x7ff) == 5) {
          LVar5 = cdr(LVar4);
          LVar6 = car(LVar5);
          LVar5 = cdr(LVar4);
          if (LVar6 == LVar3) {
            LVar5 = cdr(LVar5);
            rplacd(LVar4,LVar5);
            LVar5 = LVar4;
          }
          pDVar2 = MDStypetbl;
          LVar4 = cdr(LVar5);
          uVar1 = *(ushort *)((ulong)(pDVar2 + (LVar4 >> 9)) ^ 2);
          LVar4 = LVar5;
        }
        break;
      }
      LVar4 = cdr(datum);
      uVar7 = 0;
      if (LVar4 == 0) break;
      LVar4 = cdr(datum);
      LVar4 = car(LVar4);
      rplaca(datum,LVar4);
      LVar4 = cdr(datum);
      LVar4 = cdr(LVar4);
      rplacd(datum,LVar4);
    } while ((*(ushort *)((long)MDStypetbl + (ulong)((datum >> 9) * 2) ^ 2) & 0x7ff) == 5);
  }
  *SYSTEMCACHEVARS_word = uVar7;
  return;
}

Assistant:

static void advance_storagestate(DLword flg) {
#ifdef DEBUG
  printf("STORAGEFULLSTATE is now set to %d \n", flg);
#endif

  *STORAGEFULLSTATE_word = (S_POSITIVE | flg);
  InterfacePage->fullspaceused = 65535;
  *SYSTEMCACHEVARS_word = dremove(STORAGEFULLSTATE_index, *SYSTEMCACHEVARS_word);
}